

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

bool libcellml::equalEntities
               (EntityPtr *owner,
               vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
               *entities)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EntityImpl **ppEVar2;
  element_type *peVar3;
  bool bVar4;
  bool bVar5;
  pointer puVar6;
  size_t sVar7;
  Entity *pEVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ImportedEntityImpl *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar11;
  UnitsPtr unitsOther;
  vector<unsigned_long,_std::allocator<unsigned_long>_> unmatchedIndex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  pointer local_90;
  Component local_88;
  ImportedEntityImpl *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  pointer local_38;
  
  local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
  super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)owner;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_50,
             (long)(entities->
                   super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(entities->
                   super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_88);
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar9 = 0;
    puVar6 = local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *puVar6 = uVar9;
      uVar9 = uVar9 + 1;
      puVar6 = puVar6 + 1;
    } while (puVar6 != local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_90 = (entities->
             super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (entities->
             super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  bVar11 = local_90 == local_38;
  while (!bVar11) {
    uVar10 = 0;
    bVar4 = false;
    if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        peVar3 = ((__shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2> *)
                 &(local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
                   super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_vptr__Sp_counted_base)->_M_ptr;
        if (peVar3 == (element_type *)0x0) {
          sVar7 = 0;
        }
        else {
          sVar7 = __dynamic_cast(peVar3,&Entity::typeinfo,&Model::typeinfo,0);
        }
        if (sVar7 == 0) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          sVar7 = 0;
        }
        else {
          this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    &(local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
                      super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count)->_M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
        }
        if (sVar7 == 0) {
          peVar3 = ((__shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2> *)
                   &(local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
                     super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base)->_M_ptr;
          if (peVar3 == (element_type *)0x0) {
            sVar7 = 0;
          }
          else {
            sVar7 = __dynamic_cast(peVar3,&Entity::typeinfo,&Component::typeinfo,0);
          }
          if (sVar7 == 0) {
            local_58 = (ImportedEntityImpl *)0x0;
            sVar7 = 0;
          }
          else {
            local_58 = (ImportedEntityImpl *)
                       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &(local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
                         super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count)->_M_pi;
            if (local_58 != (ImportedEntityImpl *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &(local_58->mImportSource).
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var1 = &(local_58->mImportSource).
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
              }
            }
          }
          peVar3 = (local_90->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (peVar3 == (element_type *)0x0) {
            pEVar8 = (Entity *)0x0;
          }
          else {
            pEVar8 = (Entity *)__dynamic_cast(peVar3,&Entity::typeinfo,&Variable::typeinfo,0);
          }
          if (pEVar8 == (Entity *)0x0) {
            pEVar8 = (Entity *)0x0;
            local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_98 = (local_90->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_refcount._M_pi;
            if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_98->_M_use_count = local_98->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_98->_M_use_count = local_98->_M_use_count + 1;
              }
            }
          }
          if (pEVar8 == (Entity *)0x0) {
            peVar3 = (local_90->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            if (peVar3 == (element_type *)0x0) {
              pEVar8 = (Entity *)0x0;
            }
            else {
              pEVar8 = (Entity *)__dynamic_cast(peVar3,&Entity::typeinfo,&Reset::typeinfo,0);
            }
            if (pEVar8 == (Entity *)0x0) {
              pEVar8 = (Entity *)0x0;
              local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
              super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
            }
            else {
              local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
              super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   (local_90->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
                  super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ppEVar2 = &((local_88.super_enable_shared_from_this<libcellml::Component>.
                               _M_weak_this.
                               super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_ComponentEntity).super_NamedEntity.super_ParentedEntity
                             .super_Entity.mPimpl;
                  *(int *)ppEVar2 = *(int *)ppEVar2 + 1;
                  UNLOCK();
                }
                else {
                  ppEVar2 = &((local_88.super_enable_shared_from_this<libcellml::Component>.
                               _M_weak_this.
                               super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_ComponentEntity).super_NamedEntity.super_ParentedEntity
                             .super_Entity.mPimpl;
                  *(int *)ppEVar2 = *(int *)ppEVar2 + 1;
                }
              }
            }
            Component::reset(&local_88,sVar7);
            local_88.super_ImportedEntity._vptr_ImportedEntity =
                 local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 _vptr_Entity;
            local_88.super_ImportedEntity.mPimpl =
                 (ImportedEntityImpl *)
                 local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl;
            if ((ImportedEntityImpl *)
                local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl != (ImportedEntityImpl *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &(((ImportSourcePtr *)
                           &(local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                             super_Entity.mPimpl)->mId)->
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var1 = &(((ImportSourcePtr *)
                           &(local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                             super_Entity.mPimpl)->mId)->
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
              }
            }
            bVar5 = Entity::equals(pEVar8,(EntityPtr *)&local_88.super_ImportedEntity);
            if (local_88.super_ImportedEntity.mPimpl != (ImportedEntityImpl *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_88.super_ImportedEntity.mPimpl);
            }
            if (bVar5) {
              bVar4 = true;
            }
            if ((ImportedEntityImpl *)
                local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl != (ImportedEntityImpl *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                         super_Entity.mPimpl);
            }
            if (local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
                super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_88.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
                         super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            }
          }
          else {
            Component::variable(&local_88,sVar7);
            local_88.super_ImportedEntity._vptr_ImportedEntity =
                 local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 _vptr_Entity;
            local_88.super_ImportedEntity.mPimpl =
                 (ImportedEntityImpl *)
                 local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl;
            if ((ImportedEntityImpl *)
                local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl != (ImportedEntityImpl *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &(((ImportSourcePtr *)
                           &(local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                             super_Entity.mPimpl)->mId)->
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var1 = &(((ImportSourcePtr *)
                           &(local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                             super_Entity.mPimpl)->mId)->
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
              }
            }
            bVar5 = Entity::equals(pEVar8,(EntityPtr *)&local_88.super_ImportedEntity);
            if (local_88.super_ImportedEntity.mPimpl != (ImportedEntityImpl *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_88.super_ImportedEntity.mPimpl);
            }
            if (bVar5) {
              bVar4 = true;
            }
            if ((ImportedEntityImpl *)
                local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl != (ImportedEntityImpl *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                         super_Entity.mPimpl);
            }
          }
          this = local_58;
          if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
            this = local_58;
          }
        }
        else {
          Model::units((Model *)&local_88,sVar7);
          pEVar8 = (local_90->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_88.super_ImportedEntity._vptr_ImportedEntity =
               local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_88.super_ImportedEntity.mPimpl =
               (ImportedEntityImpl *)
               local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
               mPimpl;
          if ((ImportedEntityImpl *)
              local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
              mPimpl != (ImportedEntityImpl *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &(((ImportSourcePtr *)
                         &(local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                           super_Entity.mPimpl)->mId)->
                        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount;
              *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
              UNLOCK();
            }
            else {
              p_Var1 = &(((ImportSourcePtr *)
                         &(local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                           super_Entity.mPimpl)->mId)->
                        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount;
              *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            }
          }
          bVar5 = Entity::equals(pEVar8,(EntityPtr *)&local_88.super_ImportedEntity);
          if (local_88.super_ImportedEntity.mPimpl != (ImportedEntityImpl *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_88.super_ImportedEntity.mPimpl);
          }
          this = (ImportedEntityImpl *)
                 local_88.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl;
          if (bVar5) {
            bVar4 = true;
          }
        }
        if (this != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        uVar10 = uVar10 + 1;
      } while ((uVar10 < (ulong)((long)local_50.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_50.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3)) && (!bVar4))
      ;
    }
    if (!bVar4) break;
    puVar6 = local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + uVar10;
    if (puVar6 != local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish) {
      memmove(puVar6 + -1,puVar6,
              (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar6);
    }
    local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    local_90 = local_90 + 1;
    bVar11 = local_90 == local_38;
  }
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar11;
}

Assistant:

bool equalEntities(const EntityPtr &owner, const std::vector<EntityPtr> &entities)
{
    std::vector<size_t> unmatchedIndex(entities.size());
    std::iota(unmatchedIndex.begin(), unmatchedIndex.end(), 0);
    for (const auto &entity : entities) {
        bool entityFound = false;
        size_t index = 0;
        for (index = 0; index < unmatchedIndex.size() && !entityFound; ++index) {
            size_t currentIndex = unmatchedIndex.at(index);
            auto model = std::dynamic_pointer_cast<Model>(owner);
            if (model != nullptr) {
                auto unitsOther = model->units(currentIndex);
                if (entity->equals(unitsOther)) {
                    entityFound = true;
                }
            } else {
                auto component = std::dynamic_pointer_cast<Component>(owner);
                auto variable = std::dynamic_pointer_cast<Variable>(entity);
                if (variable != nullptr) {
                    auto variableOther = component->variable(currentIndex);
                    if (variable->equals(variableOther)) {
                        entityFound = true;
                    }
                } else {
                    auto reset = std::dynamic_pointer_cast<Reset>(entity);
                    auto resetOther = component->reset(currentIndex);
                    if (reset->equals(resetOther)) {
                        entityFound = true;
                    }
                }
            }
        }
        if (entityFound) {
            // We are going to assume here that nobody is going to add more
            // than 2,147,483,647 units to this component. And much more than
            // that in a 64-bit environment.
            unmatchedIndex.erase(unmatchedIndex.begin() + ptrdiff_t(index) - 1);
        } else {
            return false;
        }
    }
    return true;
}